

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebugIfHasDebugStream<QString,_QString> operator<<(QDebug debug,pair<QString,_QString> *pair)

{
  long lVar1;
  Data *pDVar2;
  QDebug *pQVar3;
  QString *in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)pair);
  *(undefined1 *)&(pair->first).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int> = 0;
  pQVar3 = QDebug::operator<<((QDebug *)pair,"std::pair(");
  pQVar3 = QDebug::operator<<(pQVar3,in_RDX);
  pQVar3 = QDebug::operator<<(pQVar3,", ");
  pQVar3 = QDebug::operator<<(pQVar3,in_RDX + 1);
  QDebug::operator<<(pQVar3,')');
  pDVar2 = (pair->first).d.d;
  (pair->first).d.d = (Data *)0x0;
  *(Data **)debug.stream = pDVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebugIfHasDebugStream<QString,_QString>)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebugIfHasDebugStream<T1, T2> operator<<(QDebug debug, const std::pair<T1, T2> &pair)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << "std::pair(" << pair.first << ", " << pair.second << ')';
    return debug;
}